

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_searchprogresswidget.cpp
# Opt level: O2

void SearchProgressWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c == IndexOfMethod) {
    if ((*_a[1] == canceled) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
      return;
    }
  }
  else if ((_c == InvokeMetaMethod) && (_id == 0)) {
    canceled((SearchProgressWidget *)_o);
    return;
  }
  return;
}

Assistant:

void SearchProgressWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<SearchProgressWidget *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->canceled(); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (SearchProgressWidget::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SearchProgressWidget::canceled)) {
                *result = 0;
                return;
            }
        }
    }
    (void)_a;
}